

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::truncate
          (ArrayBuilder<kj::Promise<void>_> *this,char *__file,__off_t __length)

{
  Promise<void> *pPVar1;
  RemoveConst<kj::Promise<void>_> *pRVar2;
  char *pcVar3;
  Promise<void> *target;
  size_t size_local;
  ArrayBuilder<kj::Promise<void>_> *this_local;
  
  pcVar3 = (char *)size(this);
  if (__file <= pcVar3) {
    pPVar1 = this->ptr;
    while (pPVar1 + (long)__file < this->pos) {
      pRVar2 = this->pos;
      this->pos = pRVar2 + -1;
      dtor<kj::Promise<void>>(pRVar2 + -1);
    }
    return (int)this->pos;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1b8,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }